

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::HelperInvocationDerivateCase::HelperInvocationDerivateCase
          (HelperInvocationDerivateCase *this,Context *context,char *name,char *description,
          PrimitiveType primType,int numSamples,char *derivateFunc,bool checkAbsoluteValue)

{
  undefined4 in_register_0000008c;
  allocator<char> local_29;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,name,::glcts::fixed_sample_locations_values + 1);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__HelperInvocationDerivateCase_02170df8;
  this->m_primitiveType = (PrimitiveType)description;
  this->m_numSamples = primType;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_derivateFunc,(char *)CONCAT44(in_register_0000008c,numSamples),
             &local_29);
  this->m_checkAbsoluteValue = derivateFunc._0_1_;
  this->m_numIters = 0x10;
  (this->m_program).super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
  m_data.ptr = (ShaderProgram *)0x0;
  (this->m_fbo).
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
  .m_data.ptr = (FboHelper *)0x0;
  this->m_iterNdx = 0;
  return;
}

Assistant:

HelperInvocationDerivateCase::HelperInvocationDerivateCase (Context& context, const char* name, const char* description, PrimitiveType primType, int numSamples, const char* derivateFunc, bool checkAbsoluteValue)
	: TestCase					(context, name, description)
	, m_primitiveType			(primType)
	, m_numSamples				(numSamples)
	, m_derivateFunc			(derivateFunc)
	, m_checkAbsoluteValue		(checkAbsoluteValue)
	, m_numIters				(16)
	, m_iterNdx					(0)
{
}